

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void aom_hadamard_32x32_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  tran_low_t *coeff_00;
  long lVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar19 [16];
  undefined4 uVar20;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  short sVar32;
  int iVar33;
  short sVar46;
  int iVar47;
  short sVar49;
  undefined1 auVar37 [16];
  short sVar45;
  short sVar48;
  undefined1 auVar39 [16];
  short sVar50;
  int iVar51;
  short sVar57;
  short sVar58;
  int iVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar55 [16];
  int iVar62;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar67;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar77;
  int iVar88;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar89;
  int iVar94;
  undefined1 auVar93 [16];
  int16_t temp_coeff [1024];
  tran_low_t local_860 [128];
  undefined1 auStack_660 [512];
  undefined1 auStack_460 [512];
  undefined1 auStack_260 [560];
  undefined6 uVar9;
  undefined8 uVar10;
  undefined1 auVar12 [16];
  undefined1 auVar11 [12];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar27 [16];
  undefined6 uVar21;
  undefined1 auVar28 [16];
  undefined8 uVar22;
  undefined1 auVar29 [16];
  undefined1 auVar23 [12];
  undefined1 auVar30 [16];
  undefined1 auVar25 [16];
  undefined1 auVar31 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar34 [12];
  undefined1 auVar42 [16];
  undefined1 auVar35 [12];
  undefined1 auVar43 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  undefined1 auVar63 [12];
  undefined1 auVar64 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar68 [12];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar69 [16];
  undefined1 auVar76 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar78 [16];
  undefined1 auVar85 [16];
  undefined1 auVar79 [16];
  undefined1 auVar86 [16];
  undefined1 auVar80 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  
  coeff_00 = local_860;
  uVar6 = 0;
  for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
    hadamard_16x16_sse2(src_diff + (ulong)((uint)lVar5 & 0x10) * src_stride + (ulong)(uVar6 & 0x10),
                        src_stride,coeff_00,0);
    coeff_00 = coeff_00 + 0x80;
    uVar6 = uVar6 + 0x10;
  }
  for (lVar5 = 0; (uint)lVar5 < 0x100; lVar5 = lVar5 + 8) {
    auVar16 = *(undefined1 (*) [16])((long)local_860 + lVar5 * 2);
    auVar24 = *(undefined1 (*) [16])(auStack_660 + lVar5 * 2);
    auVar19 = *(undefined1 (*) [16])(auStack_460 + lVar5 * 2);
    auVar70 = *(undefined1 (*) [16])(auStack_260 + lVar5 * 2);
    auVar15 = psraw(auVar16,0xf);
    auVar13._0_12_ = auVar16._0_12_;
    auVar13._12_2_ = auVar16._6_2_;
    auVar13._14_2_ = auVar15._6_2_;
    auVar12._12_4_ = auVar13._12_4_;
    auVar12._0_10_ = auVar16._0_10_;
    auVar12._10_2_ = auVar15._4_2_;
    auVar66._10_6_ = auVar12._10_6_;
    auVar66._0_8_ = auVar16._0_8_;
    auVar66._8_2_ = auVar16._4_2_;
    auVar1._4_8_ = auVar66._8_8_;
    auVar1._2_2_ = auVar15._2_2_;
    auVar1._0_2_ = auVar16._2_2_;
    iVar7 = CONCAT22(auVar15._0_2_,auVar16._0_2_);
    iVar51 = CONCAT22(auVar15._8_2_,auVar16._8_2_);
    auVar52._0_8_ = CONCAT26(auVar15._10_2_,CONCAT24(auVar16._10_2_,iVar51));
    auVar52._8_2_ = auVar16._12_2_;
    auVar52._10_2_ = auVar15._12_2_;
    auVar54._12_2_ = auVar16._14_2_;
    auVar54._0_12_ = auVar52;
    auVar54._14_2_ = auVar15._14_2_;
    auVar16 = psraw(auVar24,0xf);
    auVar80._0_12_ = auVar24._0_12_;
    auVar80._12_2_ = auVar24._6_2_;
    auVar80._14_2_ = auVar16._6_2_;
    auVar79._12_4_ = auVar80._12_4_;
    auVar79._0_10_ = auVar24._0_10_;
    auVar79._10_2_ = auVar16._4_2_;
    auVar78._10_6_ = auVar79._10_6_;
    auVar78._0_8_ = auVar24._0_8_;
    auVar78._8_2_ = auVar24._4_2_;
    auVar2._4_8_ = auVar78._8_8_;
    auVar2._2_2_ = auVar16._2_2_;
    auVar2._0_2_ = auVar24._2_2_;
    iVar77 = CONCAT22(auVar16._0_2_,auVar24._0_2_);
    iVar62 = CONCAT22(auVar16._8_2_,auVar24._8_2_);
    auVar63._0_8_ = CONCAT26(auVar16._10_2_,CONCAT24(auVar24._10_2_,iVar62));
    auVar63._8_2_ = auVar24._12_2_;
    auVar63._10_2_ = auVar16._12_2_;
    auVar64._12_2_ = auVar24._14_2_;
    auVar64._0_12_ = auVar63;
    auVar64._14_2_ = auVar16._14_2_;
    auVar16 = psraw(auVar19,0xf);
    auVar18._0_12_ = auVar19._0_12_;
    auVar18._12_2_ = auVar19._6_2_;
    auVar18._14_2_ = auVar16._6_2_;
    auVar17._12_4_ = auVar18._12_4_;
    auVar17._0_10_ = auVar19._0_10_;
    auVar17._10_2_ = auVar16._4_2_;
    auVar15._10_6_ = auVar17._10_6_;
    auVar15._0_8_ = auVar19._0_8_;
    auVar15._8_2_ = auVar19._4_2_;
    auVar3._4_8_ = auVar15._8_8_;
    auVar3._2_2_ = auVar16._2_2_;
    auVar3._0_2_ = auVar19._2_2_;
    iVar14 = CONCAT22(auVar16._0_2_,auVar19._0_2_);
    iVar33 = CONCAT22(auVar16._8_2_,auVar19._8_2_);
    auVar34._0_8_ = CONCAT26(auVar16._10_2_,CONCAT24(auVar19._10_2_,iVar33));
    auVar34._8_2_ = auVar19._12_2_;
    auVar34._10_2_ = auVar16._12_2_;
    auVar36._12_2_ = auVar19._14_2_;
    auVar36._0_12_ = auVar34;
    auVar36._14_2_ = auVar16._14_2_;
    auVar16 = psraw(auVar70,0xf);
    auVar92._0_12_ = auVar70._0_12_;
    auVar92._12_2_ = auVar70._6_2_;
    auVar92._14_2_ = auVar16._6_2_;
    auVar91._12_4_ = auVar92._12_4_;
    auVar91._0_10_ = auVar70._0_10_;
    auVar91._10_2_ = auVar16._4_2_;
    auVar90._10_6_ = auVar91._10_6_;
    auVar90._0_8_ = auVar70._0_8_;
    auVar90._8_2_ = auVar70._4_2_;
    auVar4._4_8_ = auVar90._8_8_;
    auVar4._2_2_ = auVar16._2_2_;
    auVar4._0_2_ = auVar70._2_2_;
    iVar89 = CONCAT22(auVar16._0_2_,auVar70._0_2_);
    iVar67 = CONCAT22(auVar16._8_2_,auVar70._8_2_);
    auVar68._0_8_ = CONCAT26(auVar16._10_2_,CONCAT24(auVar70._10_2_,iVar67));
    auVar68._8_2_ = auVar70._12_2_;
    auVar68._10_2_ = auVar16._12_2_;
    auVar69._12_2_ = auVar70._14_2_;
    auVar69._0_12_ = auVar68;
    auVar69._14_2_ = auVar16._14_2_;
    iVar59 = (int)((ulong)auVar52._0_8_ >> 0x20);
    iVar94 = (int)((ulong)auVar63._0_8_ >> 0x20);
    iVar47 = (int)((ulong)auVar34._0_8_ >> 0x20);
    iVar88 = (int)((ulong)auVar68._0_8_ >> 0x20);
    auVar70._0_4_ = iVar77 + iVar7 >> 2;
    auVar70._4_4_ = auVar2._0_4_ + auVar1._0_4_ >> 2;
    auVar70._8_4_ = auVar78._8_4_ + auVar66._8_4_ >> 2;
    auVar70._12_4_ = auVar79._12_4_ + auVar12._12_4_ >> 2;
    auVar16._0_4_ = iVar7 - iVar77 >> 2;
    auVar16._4_4_ = auVar1._0_4_ - auVar2._0_4_ >> 2;
    auVar16._8_4_ = auVar66._8_4_ - auVar78._8_4_ >> 2;
    auVar16._12_4_ = auVar12._12_4_ - auVar79._12_4_ >> 2;
    auVar65._0_4_ = iVar89 + iVar14 >> 2;
    auVar65._4_4_ = auVar4._0_4_ + auVar3._0_4_ >> 2;
    auVar65._8_4_ = auVar90._8_4_ + auVar15._8_4_ >> 2;
    auVar65._12_4_ = auVar91._12_4_ + auVar17._12_4_ >> 2;
    auVar19._0_4_ = iVar14 - iVar89 >> 2;
    auVar19._4_4_ = auVar3._0_4_ - auVar4._0_4_ >> 2;
    auVar19._8_4_ = auVar15._8_4_ - auVar90._8_4_ >> 2;
    auVar19._12_4_ = auVar17._12_4_ - auVar91._12_4_ >> 2;
    auVar93._0_4_ = iVar62 + iVar51 >> 2;
    auVar93._4_4_ = iVar94 + iVar59 >> 2;
    auVar93._8_4_ = auVar63._8_4_ + auVar52._8_4_ >> 2;
    auVar93._12_4_ = auVar64._12_4_ + auVar54._12_4_ >> 2;
    auVar24 = packssdw(auVar70,auVar93);
    auVar55._0_4_ = iVar51 - iVar62 >> 2;
    auVar55._4_4_ = iVar59 - iVar94 >> 2;
    auVar55._8_4_ = auVar52._8_4_ - auVar63._8_4_ >> 2;
    auVar55._12_4_ = auVar54._12_4_ - auVar64._12_4_ >> 2;
    auVar16 = packssdw(auVar16,auVar55);
    auVar81._0_4_ = iVar67 + iVar33 >> 2;
    auVar81._4_4_ = iVar88 + iVar47 >> 2;
    auVar81._8_4_ = auVar68._8_4_ + auVar34._8_4_ >> 2;
    auVar81._12_4_ = auVar69._12_4_ + auVar36._12_4_ >> 2;
    auVar66 = packssdw(auVar65,auVar81);
    auVar37._0_4_ = iVar33 - iVar67 >> 2;
    auVar37._4_4_ = iVar47 - iVar88 >> 2;
    auVar37._8_4_ = auVar34._8_4_ - auVar68._8_4_ >> 2;
    auVar37._12_4_ = auVar36._12_4_ - auVar69._12_4_ >> 2;
    auVar19 = packssdw(auVar19,auVar37);
    sVar32 = auVar66._0_2_ + auVar24._0_2_;
    sVar45 = auVar66._2_2_ + auVar24._2_2_;
    uVar8 = CONCAT22(sVar45,sVar32);
    sVar46 = auVar66._4_2_ + auVar24._4_2_;
    uVar9 = CONCAT24(sVar46,uVar8);
    sVar48 = auVar66._6_2_ + auVar24._6_2_;
    uVar10 = CONCAT26(sVar48,uVar9);
    sVar49 = auVar66._8_2_ + auVar24._8_2_;
    auVar35._0_10_ = CONCAT28(sVar49,uVar10);
    auVar35._10_2_ = auVar66._10_2_ + auVar24._10_2_;
    auVar38._12_2_ = auVar66._12_2_ + auVar24._12_2_;
    auVar38._0_12_ = auVar35;
    auVar38._14_2_ = auVar66._14_2_ + auVar24._14_2_;
    sVar50 = auVar19._0_2_ + auVar16._0_2_;
    sVar57 = auVar19._2_2_ + auVar16._2_2_;
    uVar20 = CONCAT22(sVar57,sVar50);
    sVar58 = auVar19._4_2_ + auVar16._4_2_;
    uVar21 = CONCAT24(sVar58,uVar20);
    sVar60 = auVar19._6_2_ + auVar16._6_2_;
    uVar22 = CONCAT26(sVar60,uVar21);
    sVar61 = auVar19._8_2_ + auVar16._8_2_;
    auVar53._0_10_ = CONCAT28(sVar61,uVar22);
    auVar53._10_2_ = auVar19._10_2_ + auVar16._10_2_;
    auVar56._12_2_ = auVar19._12_2_ + auVar16._12_2_;
    auVar56._0_12_ = auVar53;
    auVar56._14_2_ = auVar19._14_2_ + auVar16._14_2_;
    auVar70 = psraw(auVar38,0xf);
    auVar87._12_2_ = sVar48;
    auVar87._0_12_ = auVar35;
    auVar87._14_2_ = auVar70._6_2_;
    auVar86._12_4_ = auVar87._12_4_;
    auVar86._10_2_ = auVar70._4_2_;
    auVar86._0_10_ = auVar35._0_10_;
    auVar85._10_6_ = auVar86._10_6_;
    auVar85._8_2_ = sVar46;
    auVar85._0_8_ = uVar10;
    auVar84._8_8_ = auVar85._8_8_;
    auVar84._6_2_ = auVar70._2_2_;
    auVar84._0_6_ = uVar9;
    auVar83._6_10_ = auVar84._6_10_;
    auVar83._4_2_ = sVar45;
    auVar83._0_4_ = uVar8;
    auVar82._4_12_ = auVar83._4_12_;
    auVar82._2_2_ = auVar70._0_2_;
    auVar82._0_2_ = sVar32;
    *(undefined1 (*) [16])coeff = auVar82;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0x20) = sVar49;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 2) = auVar70._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 4) = auVar35._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 6) = auVar70._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 8) = auVar38._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 10) = auVar70._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 0xc) = auVar38._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x20) + 0xe) = auVar70._14_2_;
    auVar70 = psraw(auVar56,0xf);
    auVar76._12_2_ = sVar60;
    auVar76._0_12_ = auVar53;
    auVar76._14_2_ = auVar70._6_2_;
    auVar75._12_4_ = auVar76._12_4_;
    auVar75._10_2_ = auVar70._4_2_;
    auVar75._0_10_ = auVar53._0_10_;
    auVar74._10_6_ = auVar75._10_6_;
    auVar74._8_2_ = sVar58;
    auVar74._0_8_ = uVar22;
    auVar73._8_8_ = auVar74._8_8_;
    auVar73._6_2_ = auVar70._2_2_;
    auVar73._0_6_ = uVar21;
    auVar72._6_10_ = auVar73._6_10_;
    auVar72._4_2_ = sVar57;
    auVar72._0_4_ = uVar20;
    auVar71._4_12_ = auVar72._4_12_;
    auVar71._2_2_ = auVar70._0_2_;
    auVar71._0_2_ = sVar50;
    *(undefined1 (*) [16])((long)coeff + 0x400) = auVar71;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0x420) = sVar61;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 2) = auVar70._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 4) = auVar53._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 6) = auVar70._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 8) = auVar56._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 10) = auVar70._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 0xc) = auVar56._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x420) + 0xe) = auVar70._14_2_;
    sVar50 = auVar24._0_2_ - auVar66._0_2_;
    sVar57 = auVar24._2_2_ - auVar66._2_2_;
    uVar20 = CONCAT22(sVar57,sVar50);
    sVar58 = auVar24._4_2_ - auVar66._4_2_;
    uVar21 = CONCAT24(sVar58,uVar20);
    sVar60 = auVar24._6_2_ - auVar66._6_2_;
    uVar22 = CONCAT26(sVar60,uVar21);
    sVar61 = auVar24._8_2_ - auVar66._8_2_;
    auVar23._0_10_ = CONCAT28(sVar61,uVar22);
    auVar23._10_2_ = auVar24._10_2_ - auVar66._10_2_;
    auVar25._12_2_ = auVar24._12_2_ - auVar66._12_2_;
    auVar25._0_12_ = auVar23;
    auVar25._14_2_ = auVar24._14_2_ - auVar66._14_2_;
    sVar32 = auVar16._0_2_ - auVar19._0_2_;
    sVar45 = auVar16._2_2_ - auVar19._2_2_;
    uVar8 = CONCAT22(sVar45,sVar32);
    sVar46 = auVar16._4_2_ - auVar19._4_2_;
    uVar9 = CONCAT24(sVar46,uVar8);
    sVar48 = auVar16._6_2_ - auVar19._6_2_;
    uVar10 = CONCAT26(sVar48,uVar9);
    sVar49 = auVar16._8_2_ - auVar19._8_2_;
    auVar11._0_10_ = CONCAT28(sVar49,uVar10);
    auVar11._10_2_ = auVar16._10_2_ - auVar19._10_2_;
    auVar24._12_2_ = auVar16._12_2_ - auVar19._12_2_;
    auVar24._0_12_ = auVar11;
    auVar24._14_2_ = auVar16._14_2_ - auVar19._14_2_;
    auVar16 = psraw(auVar25,0xf);
    auVar44._12_2_ = sVar60;
    auVar44._0_12_ = auVar23;
    auVar44._14_2_ = auVar16._6_2_;
    auVar43._12_4_ = auVar44._12_4_;
    auVar43._10_2_ = auVar16._4_2_;
    auVar43._0_10_ = auVar23._0_10_;
    auVar42._10_6_ = auVar43._10_6_;
    auVar42._8_2_ = sVar58;
    auVar42._0_8_ = uVar22;
    auVar41._8_8_ = auVar42._8_8_;
    auVar41._6_2_ = auVar16._2_2_;
    auVar41._0_6_ = uVar21;
    auVar40._6_10_ = auVar41._6_10_;
    auVar40._4_2_ = sVar57;
    auVar40._0_4_ = uVar20;
    auVar39._4_12_ = auVar40._4_12_;
    auVar39._2_2_ = auVar16._0_2_;
    auVar39._0_2_ = sVar50;
    *(undefined1 (*) [16])((long)coeff + 0x800) = auVar39;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0x820) = sVar61;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 2) = auVar16._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 4) = auVar23._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 6) = auVar16._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 8) = auVar25._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 10) = auVar16._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 0xc) = auVar25._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0x820) + 0xe) = auVar16._14_2_;
    auVar16 = psraw(auVar24,0xf);
    auVar31._12_2_ = sVar48;
    auVar31._0_12_ = auVar11;
    auVar31._14_2_ = auVar16._6_2_;
    auVar30._12_4_ = auVar31._12_4_;
    auVar30._10_2_ = auVar16._4_2_;
    auVar30._0_10_ = auVar11._0_10_;
    auVar29._10_6_ = auVar30._10_6_;
    auVar29._8_2_ = sVar46;
    auVar29._0_8_ = uVar10;
    auVar28._8_8_ = auVar29._8_8_;
    auVar28._6_2_ = auVar16._2_2_;
    auVar28._0_6_ = uVar9;
    auVar27._6_10_ = auVar28._6_10_;
    auVar27._4_2_ = sVar45;
    auVar27._0_4_ = uVar8;
    auVar26._4_12_ = auVar27._4_12_;
    auVar26._2_2_ = auVar16._0_2_;
    auVar26._0_2_ = sVar32;
    *(undefined1 (*) [16])((long)coeff + 0xc00) = auVar26;
    *(short *)*(undefined1 (*) [16])((long)coeff + 0xc20) = sVar49;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 2) = auVar16._8_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 4) = auVar11._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 6) = auVar16._10_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 8) = auVar24._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 10) = auVar16._12_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 0xc) = auVar24._14_2_;
    *(short *)((long)*(undefined1 (*) [16])((long)coeff + 0xc20) + 0xe) = auVar16._14_2_;
    coeff = (tran_low_t *)
            ((long)*(undefined1 (*) [16])((long)coeff + 0x10) + (ulong)((uint)lVar5 & 8) * 4);
  }
  return;
}

Assistant:

void aom_hadamard_32x32_sse2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  // For high bitdepths, it is unnecessary to store_tran_low
  // (mult/unpack/store), then load_tran_low (load/pack) the same memory in the
  // next stage.  Output to an intermediate buffer first, then store_tran_low()
  // in the final stage.
  DECLARE_ALIGNED(32, int16_t, temp_coeff[32 * 32]);
  int16_t *t_coeff = temp_coeff;
  int idx;
  __m128i coeff0_lo, coeff1_lo, coeff2_lo, coeff3_lo, b0_lo, b1_lo, b2_lo,
      b3_lo;
  __m128i coeff0_hi, coeff1_hi, coeff2_hi, coeff3_hi, b0_hi, b1_hi, b2_hi,
      b3_hi;
  __m128i b0, b1, b2, b3;
  const __m128i zero = _mm_setzero_si128();
  for (idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 16 * src_stride + (idx & 0x01) * 16;
    hadamard_16x16_sse2(src_ptr, src_stride,
                        (tran_low_t *)(t_coeff + idx * 256), 0);
  }

  for (idx = 0; idx < 256; idx += 8) {
    __m128i coeff0 = _mm_load_si128((const __m128i *)t_coeff);
    __m128i coeff1 = _mm_load_si128((const __m128i *)(t_coeff + 256));
    __m128i coeff2 = _mm_load_si128((const __m128i *)(t_coeff + 512));
    __m128i coeff3 = _mm_load_si128((const __m128i *)(t_coeff + 768));

    // Sign extend 16 bit to 32 bit.
    sign_extend_16bit_to_32bit_sse2(coeff0, zero, &coeff0_lo, &coeff0_hi);
    sign_extend_16bit_to_32bit_sse2(coeff1, zero, &coeff1_lo, &coeff1_hi);
    sign_extend_16bit_to_32bit_sse2(coeff2, zero, &coeff2_lo, &coeff2_hi);
    sign_extend_16bit_to_32bit_sse2(coeff3, zero, &coeff3_lo, &coeff3_hi);

    b0_lo = _mm_add_epi32(coeff0_lo, coeff1_lo);
    b0_hi = _mm_add_epi32(coeff0_hi, coeff1_hi);

    b1_lo = _mm_sub_epi32(coeff0_lo, coeff1_lo);
    b1_hi = _mm_sub_epi32(coeff0_hi, coeff1_hi);

    b2_lo = _mm_add_epi32(coeff2_lo, coeff3_lo);
    b2_hi = _mm_add_epi32(coeff2_hi, coeff3_hi);

    b3_lo = _mm_sub_epi32(coeff2_lo, coeff3_lo);
    b3_hi = _mm_sub_epi32(coeff2_hi, coeff3_hi);

    b0_lo = _mm_srai_epi32(b0_lo, 2);
    b1_lo = _mm_srai_epi32(b1_lo, 2);
    b2_lo = _mm_srai_epi32(b2_lo, 2);
    b3_lo = _mm_srai_epi32(b3_lo, 2);

    b0_hi = _mm_srai_epi32(b0_hi, 2);
    b1_hi = _mm_srai_epi32(b1_hi, 2);
    b2_hi = _mm_srai_epi32(b2_hi, 2);
    b3_hi = _mm_srai_epi32(b3_hi, 2);

    b0 = _mm_packs_epi32(b0_lo, b0_hi);
    b1 = _mm_packs_epi32(b1_lo, b1_hi);
    b2 = _mm_packs_epi32(b2_lo, b2_hi);
    b3 = _mm_packs_epi32(b3_lo, b3_hi);

    coeff0 = _mm_add_epi16(b0, b2);
    coeff1 = _mm_add_epi16(b1, b3);
    store_tran_low_offset_4(coeff0, coeff);
    store_tran_low_offset_4(coeff1, coeff + 256);

    coeff2 = _mm_sub_epi16(b0, b2);
    coeff3 = _mm_sub_epi16(b1, b3);
    store_tran_low_offset_4(coeff2, coeff + 512);
    store_tran_low_offset_4(coeff3, coeff + 768);

    // Increment the pointer by 4 and 12 in alternate iterations(instead of 8)
    // to ensure the coherency with the implementation of
    // store_tran_low_offset_4()
    coeff += (4 + (((idx >> 3) & 1) << 3));
    t_coeff += 8;
  }
}